

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPMapClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPMapClause *this)

{
  OpenMPMapClauseModifier OVar1;
  OpenMPMapClauseModifier OVar2;
  OpenMPMapClauseModifier OVar3;
  OpenMPMapClauseType OVar4;
  string clause_string;
  allocator<char> aaStack_68 [8];
  ulong local_60;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"map ",aaStack_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)aaStack_68,"(",(allocator<char> *)&local_48);
  OVar1 = this->modifier1;
  OVar2 = this->modifier2;
  OVar3 = this->modifier3;
  OVar4 = this->type;
  if ((OVar1 == OMPC_MAP_MODIFIER_always) || (OVar1 == OMPC_MAP_MODIFIER_close)) {
LAB_0015db6f:
    std::__cxx11::string::append((char *)aaStack_68);
  }
  else if (OVar1 == OMPC_MAP_MODIFIER_mapper) {
    std::__cxx11::string::append((char *)aaStack_68);
    std::__cxx11::string::append((char *)aaStack_68);
    std::__cxx11::string::string((string *)&local_48,(string *)&this->mapper_identifier);
    std::__cxx11::string::append((string *)aaStack_68);
    std::__cxx11::string::~string((string *)&local_48);
    goto LAB_0015db6f;
  }
  if (OVar2 == OMPC_MAP_MODIFIER_always) {
LAB_0015dbe4:
    std::__cxx11::string::append((char *)aaStack_68);
  }
  else {
    if (OVar2 == OMPC_MAP_MODIFIER_mapper) {
      std::__cxx11::string::append((char *)aaStack_68);
      std::__cxx11::string::append((char *)aaStack_68);
      std::__cxx11::string::string((string *)&local_48,(string *)&this->mapper_identifier);
      std::__cxx11::string::append((string *)aaStack_68);
      std::__cxx11::string::~string((string *)&local_48);
      goto LAB_0015dbe4;
    }
    if (OVar2 == OMPC_MAP_MODIFIER_close) goto LAB_0015dbe4;
  }
  if (OVar3 != OMPC_MAP_MODIFIER_always) {
    if (OVar3 == OMPC_MAP_MODIFIER_mapper) {
      std::__cxx11::string::append((char *)aaStack_68);
      std::__cxx11::string::append((char *)aaStack_68);
      std::__cxx11::string::string((string *)&local_48,(string *)&this->mapper_identifier);
      std::__cxx11::string::append((string *)aaStack_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else if (OVar3 != OMPC_MAP_MODIFIER_close) goto LAB_0015dc5e;
  }
  std::__cxx11::string::append((char *)aaStack_68);
LAB_0015dc5e:
  if (OVar4 < OMPC_MAP_TYPE_unknown) {
    std::__cxx11::string::append((char *)aaStack_68);
  }
  if (1 < local_60) {
    std::__cxx11::string::append((char *)aaStack_68);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_48,&this->super_OpenMPClause);
  std::__cxx11::string::append((string *)aaStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::append((char *)aaStack_68);
  if (3 < local_60) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)aaStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPMapClause::toString() {

    std::string result = "map ";
    std::string clause_string = "(";
    OpenMPMapClauseModifier modifier1 = this->getModifier1();
    OpenMPMapClauseModifier modifier2 = this->getModifier2();
    OpenMPMapClauseModifier modifier3 = this->getModifier3();

    OpenMPMapClauseType type = this->getType();
    switch (modifier1) {
        case OMPC_MAP_MODIFIER_always:
            clause_string += "always";
            break;
        case OMPC_MAP_MODIFIER_close:
            clause_string += "close";
            break;
        case OMPC_MAP_MODIFIER_mapper:
            clause_string += "mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }
    switch (modifier2) {
        case OMPC_MAP_MODIFIER_always:
            clause_string += " always";
            break;
        case OMPC_MAP_MODIFIER_close:
            clause_string += " close";
            break;
        case OMPC_MAP_MODIFIER_mapper:
            clause_string += " mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }
    switch (modifier3) {
        case OMPC_MAP_MODIFIER_always:
            clause_string += " always";
            break;
        case OMPC_MAP_MODIFIER_close:
            clause_string += " close";
            break;
        case OMPC_MAP_MODIFIER_mapper:
            clause_string += " mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }

    switch (type) {
        case OMPC_MAP_TYPE_to:
            clause_string += " to";
            break;
        case OMPC_MAP_TYPE_from:
            clause_string += " from";
            break;
        case OMPC_MAP_TYPE_tofrom:
            clause_string += " tofrom";
            break;
        case OMPC_MAP_TYPE_alloc:
            clause_string += " alloc";
            break;
        case OMPC_MAP_TYPE_release:
            clause_string += " release";
            break;
        case OMPC_MAP_TYPE_delete:
            clause_string += " delete";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}